

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::RepeatedPrimitiveGenericTypeTraits::InitializeDefaultRepeatedFields
               (void)

{
  _func_void *in_stack_00000008;
  
  default_repeated_field_int32_ = (undefined8 *)operator_new(0x10);
  *default_repeated_field_int32_ = 0;
  default_repeated_field_int32_[1] = 0;
  default_repeated_field_int64_ = (undefined8 *)operator_new(0x10);
  *default_repeated_field_int64_ = 0;
  default_repeated_field_int64_[1] = 0;
  default_repeated_field_uint32_ = (undefined8 *)operator_new(0x10);
  *default_repeated_field_uint32_ = 0;
  default_repeated_field_uint32_[1] = 0;
  default_repeated_field_uint64_ = (undefined8 *)operator_new(0x10);
  *default_repeated_field_uint64_ = 0;
  default_repeated_field_uint64_[1] = 0;
  default_repeated_field_double_ = (undefined8 *)operator_new(0x10);
  *default_repeated_field_double_ = 0;
  default_repeated_field_double_[1] = 0;
  default_repeated_field_float_ = (undefined8 *)operator_new(0x10);
  *default_repeated_field_float_ = 0;
  default_repeated_field_float_[1] = 0;
  default_repeated_field_bool_ = (undefined8 *)operator_new(0x10);
  *default_repeated_field_bool_ = 0;
  default_repeated_field_bool_[1] = 0;
  OnShutdown(in_stack_00000008);
  return;
}

Assistant:

void RepeatedPrimitiveGenericTypeTraits::InitializeDefaultRepeatedFields() {
  default_repeated_field_int32_ = new RepeatedField<int32>;
  default_repeated_field_int64_ = new RepeatedField<int64>;
  default_repeated_field_uint32_ = new RepeatedField<uint32>;
  default_repeated_field_uint64_ = new RepeatedField<uint64>;
  default_repeated_field_double_ = new RepeatedField<double>;
  default_repeated_field_float_ = new RepeatedField<float>;
  default_repeated_field_bool_ = new RepeatedField<bool>;
  OnShutdown(&DestroyDefaultRepeatedFields);
}